

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.cpp
# Opt level: O0

void __thiscall
OpenMD::Inversion::Inversion
          (Inversion *this,Atom *atom1,Atom *atom2,Atom *atom3,Atom *atom4,InversionType *it)

{
  undefined4 uVar1;
  reference ppAVar2;
  value_type in_RCX;
  value_type in_RDX;
  value_type in_RSI;
  undefined8 *in_RDI;
  value_type in_R8;
  undefined8 in_R9;
  ShortRangeInteraction *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *this_00;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_stack_ffffffffffffffa0;
  
  ShortRangeInteraction::ShortRangeInteraction(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__Inversion_0034c548;
  in_RDI[0xd] = in_R9;
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::resize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 2);
  ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[](this_00,0);
  *ppAVar2 = in_RSI;
  ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[](this_00,1);
  *ppAVar2 = in_RDX;
  ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[](this_00,2);
  *ppAVar2 = in_RCX;
  ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[](this_00,3);
  *ppAVar2 = in_R8;
  uVar1 = (**(code **)(*(long *)in_RDI[0xd] + 0x18))();
  *(undefined4 *)(in_RDI + 0xe) = uVar1;
  return;
}

Assistant:

Inversion::Inversion(Atom* atom1, Atom* atom2, Atom* atom3, Atom* atom4,
                       InversionType* it) :
      ShortRangeInteraction(),
      inversionType_(it) {
    atoms_.resize(4);
    atoms_[0] = atom1;
    atoms_[1] = atom2;
    atoms_[2] = atom3;
    atoms_[3] = atom4;

    inversionKey_ = inversionType_->getKey();
  }